

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-3.c
# Opt level: O1

int FeederBig2(void)

{
  uint uVar1;
  FILE *__stream;
  clock_t cVar2;
  clock_t cVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  char output [501];
  char acStack_218 [504];
  
  __stream = fopen("in.txt","w+");
  iVar6 = 0;
  printf("Creating Large test... ");
  cVar2 = clock();
  if (__stream == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
    iVar6 = -1;
  }
  else {
    fprintf(__stream,"%d\n",0x44a8);
    memset(acStack_218,0,0x1f5);
    memset(acStack_218,0x61,500);
    GenerateSequence((FILE *)__stream,0x1f1,3,acStack_218);
    fwrite("tree\n",5,1,__stream);
    cVar3 = clock();
    fclose(__stream);
    testTimeOut = (int)cVar3 - (int)cVar2;
    uVar1 = RoundUptoThousand(testTimeOut);
    printf("done in T=%ld seconds. Starting exe with timeout T+3 seconds... ",(ulong)uVar1 / 1000000
          );
    testTimeOut = testTimeOut + 3000000;
    sVar4 = GetLabPointerSize();
    sVar5 = GetLabPointerSize();
    LabMemoryLimit = (sVar4 + sVar5 * 2) * 0x4767 + 0xc85358;
  }
  return iVar6;
}

Assistant:

static int FeederBig2(void) {
    FILE *const in = fopen("in.txt", "w+");
    printf("Creating Large test... ");
    clock_t start = clock();
    int n = 17576;
    int finalAmountVerts = 18279;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(in, "%d\n", n);
    char output[500 + 1] = "";
    memset(output, 'a', sizeof(char) * 500);
    GenerateSequence(in, 497, 3, output);
    fprintf(in, "tree\n");
    clock_t end = clock();
    fclose(in);
    testTimeOut = end - start;
    printf("done in T=%ld seconds. Starting exe with timeout T+3 seconds... ", RoundUptoThousand(testTimeOut) / CLOCKS_PER_SEC);
    testTimeOut = testTimeOut + CLOCKS_PER_SEC * 3;
    size_t memoryForTreeNodes = finalAmountVerts * (GetLabPointerSize() + sizeof(int) * 2 + 2 * GetLabPointerSize());
    size_t memoryForChars = (n * 500 * sizeof(char));
    LabMemoryLimit = memoryForChars + memoryForTreeNodes + MIN_PROCESS_RSS_BYTES;
    return 0;
}